

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

void __thiscall Json::StyledWriter::writeValue(StyledWriter *this,Value *value)

{
  string *psVar1;
  pointer pbVar2;
  byte bVar3;
  bool bVar4;
  size_t sVar5;
  Value *pVVar6;
  uint uVar7;
  int iVar8;
  LargestUInt value_00;
  char *value_01;
  LargestInt value_02;
  Value *root;
  char *pcVar9;
  pointer pbVar10;
  Json *pJVar11;
  bool bVar12;
  double value_03;
  Members members;
  string local_68;
  Members local_48;
  
  bVar3 = (byte)*(ushort *)&value->field_0x8;
  if (7 < bVar3) {
    return;
  }
  iVar8 = 0x121c64;
  uVar7 = (uint)((long)&switchD_00118381::switchdataD_00121c64 +
                (long)(int)(&switchD_00118381::switchdataD_00121c64)[bVar3]);
  switch(bVar3) {
  case 0:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"null","");
    pushValue(this,&local_68);
    goto LAB_00118707;
  case 1:
    pJVar11 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar11,value_02);
    pushValue(this,&local_68);
    break;
  case 2:
    pJVar11 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_68,pJVar11,value_00);
    pushValue(this,&local_68);
    break;
  case 3:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_68,(Json *)0x0,value_03,true,uVar7);
    pushValue(this,&local_68);
    break;
  case 4:
    bVar4 = bVar3 == 4;
    uVar7 = (uint)CONCAT71((int7)((ulong)((long)&switchD_00118381::switchdataD_00121c64 +
                                         (long)(int)(&switchD_00118381::switchdataD_00121c64)[bVar3]
                                         ) >> 8),bVar4);
    pJVar11 = (Json *)(value->value_).string_;
    bVar12 = pJVar11 != (Json *)0x0;
    if (bVar12 && bVar4) {
      if ((*(ushort *)&value->field_0x8 >> 8 & 1) == 0) {
        sVar5 = strlen((char *)pJVar11);
        iVar8 = (int)sVar5;
      }
      else {
        iVar8 = *(int *)pJVar11;
        pJVar11 = pJVar11 + 4;
      }
      iVar8 = iVar8 + (int)pJVar11;
    }
    if (bVar12 && bVar4) {
      valueToQuotedStringN_abi_cxx11_
                (&local_68,pJVar11,(char *)(ulong)(uint)(iVar8 - (int)pJVar11),uVar7);
      pushValue(this,&local_68);
      break;
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
    pushValue(this,&local_68);
LAB_00118707:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_001186cd;
  case 5:
    bVar4 = Value::asBool(value);
    pcVar9 = "false";
    if (bVar4) {
      pcVar9 = "true";
    }
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,pcVar9,pcVar9 + ((ulong)bVar4 ^ 5));
    pushValue(this,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return;
    }
    goto LAB_001186cd;
  case 6:
    writeArrayValue(this,value);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_(&local_48,value);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{}","");
      pushValue(this,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_001185af;
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"{","");
      writeIndent(this);
      psVar1 = &this->document_;
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      indent(this);
      pbVar10 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        pcVar9 = (pbVar10->_M_dataplus)._M_p;
        pVVar6 = Value::find(value,pcVar9,pcVar9 + pbVar10->_M_string_length);
        root = (Value *)kNull;
        if (pVVar6 != (Value *)0x0) {
          root = pVVar6;
        }
        writeCommentBeforeValue(this,root);
        valueToQuotedString_abi_cxx11_(&local_68,(Json *)(pbVar10->_M_dataplus)._M_p,value_01);
        writeIndent(this);
        std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p);
        }
        std::__cxx11::string::append((char *)psVar1);
        writeValue(this,root);
        pbVar2 = local_48.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar10 = pbVar10 + 1;
        if (pbVar10 !=
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__cxx11::string::push_back((char)psVar1);
        }
        writeCommentAfterValueOnSameLine(this,root);
      } while (pbVar10 != pbVar2);
      unindent(this);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"}","");
      writeIndent(this);
      std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_68._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_001185af;
    }
    operator_delete(local_68._M_dataplus._M_p);
LAB_001185af:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
LAB_001186cd:
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void StyledWriter::writeValue(const Value& value) {
  switch (value.type()) {
  case nullValue:
    pushValue("null");
    break;
  case intValue:
    pushValue(valueToString(value.asLargestInt()));
    break;
  case uintValue:
    pushValue(valueToString(value.asLargestUInt()));
    break;
  case realValue:
    pushValue(valueToString(value.asDouble()));
    break;
  case stringValue:
  {
    // Is NULL possible for value.string_?
    char const* str;
    char const* end;
    bool ok = value.getString(&str, &end);
    if (ok) pushValue(valueToQuotedStringN(str, static_cast<unsigned>(end-str)));
    else pushValue("");
    break;
  }
  case booleanValue:
    pushValue(valueToString(value.asBool()));
    break;
  case arrayValue:
    writeArrayValue(value);
    break;
  case objectValue: {
    Value::Members members(value.getMemberNames());
    if (members.empty())
      pushValue("{}");
    else {
      writeWithIndent("{");
      indent();
      Value::Members::iterator it = members.begin();
      for (;;) {
        const JSONCPP_STRING& name = *it;
        const Value& childValue = value[name];
        writeCommentBeforeValue(childValue);
        writeWithIndent(valueToQuotedString(name.c_str()));
        document_ += " : ";
        writeValue(childValue);
        if (++it == members.end()) {
          writeCommentAfterValueOnSameLine(childValue);
          break;
        }
        document_ += ',';
        writeCommentAfterValueOnSameLine(childValue);
      }
      unindent();
      writeWithIndent("}");
    }
  } break;
  }
}